

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O3

int bitmap_and_compl(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  byte bVar1;
  bitmap_t pVVar2;
  bitmap_t pVVar3;
  bitmap_el_t *pbVar4;
  bitmap_el_t *pbVar5;
  MIR_context_t ctx;
  int extraout_EAX;
  int extraout_EAX_00;
  bitmap_t pVVar6;
  char *pcVar7;
  char *pcVar8;
  bitmap_t unaff_RBX;
  bitmap_t pVVar9;
  bitmap_t nb;
  char *pcVar10;
  bitmap_t pVVar11;
  bitmap_t pVVar12;
  bitmap_el_t bVar13;
  ulong uVar14;
  bitmap_t unaff_R14;
  bitmap_t unaff_R15;
  
  if (src1 == (bitmap_t)0x0) {
    bitmap_and_compl_cold_4();
    nb = src1;
    pVVar12 = dst;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb = src1;
    pVVar12 = dst;
    unaff_R14 = src2;
    if (src2 == (bitmap_t)0x0) goto LAB_00166118;
    pVVar2 = (bitmap_t)src2->els_num;
    pVVar3 = (bitmap_t)src1->els_num;
    pVVar9 = pVVar2;
    if (pVVar2 < pVVar3) {
      pVVar9 = pVVar3;
    }
    nb = (bitmap_t)((long)pVVar9 << 6);
    bitmap_expand(dst,(size_t)nb);
    unaff_RBX = dst;
    unaff_R15 = src1;
    if (dst != (bitmap_t)0x0) {
      pbVar4 = dst->varr;
      if (pVVar9 == (bitmap_t)0x0) {
        if (pbVar4 != (bitmap_el_t *)0x0) {
          pVVar6 = (bitmap_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar5 = src1->varr;
        nb = (bitmap_t)src2->varr;
        pVVar6 = (bitmap_t)0x0;
        pVVar11 = (bitmap_t)0x0;
        do {
          if (pVVar11 < pVVar3) {
            bVar13 = pbVar5[(long)pVVar11];
          }
          else {
            bVar13 = 0;
          }
          uVar14 = 0xffffffffffffffff;
          if (pVVar11 < pVVar2) {
            uVar14 = ~(&nb->els_num)[(long)pVVar11];
          }
          pVVar12 = (bitmap_t)((long)&pVVar11->els_num + 1);
          if ((uVar14 & bVar13) != 0) {
            pVVar6 = pVVar12;
          }
          pbVar4[(long)pVVar11] = uVar14 & bVar13;
          pVVar11 = pVVar12;
        } while (pVVar9 != pVVar12);
        if (pVVar6 <= (bitmap_t)dst->els_num) {
LAB_00166101:
          dst->els_num = (size_t)pVVar6;
          return (int)pbVar4;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  dst = unaff_RBX;
  src2 = unaff_R14;
  src1 = unaff_R15;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pVVar12[1].els_num != (FILE *)0x0) && (1 < (int)pVVar12[1].size)) {
    bVar1 = *(byte *)((long)&nb->size + 1);
    pcVar10 = "may/must alloca ";
    ctx = (MIR_context_t)pVVar12->els_num;
    if ((bVar1 & 3) == 0) {
      pcVar10 = "must alloca";
    }
    pcVar7 = "const val";
    pcVar8 = "";
    if (bVar1 != 0) {
      pcVar8 = pcVar10;
    }
    if ((char)nb->size == '\0') {
      pcVar7 = "val";
    }
    fprintf((FILE *)pVVar12[1].els_num,"%s%s=%lld for insn %lu:",pcVar8,pcVar7,nb[1].els_num,
            (ulong)*(uint *)((long)&nb->size + 4),dst,src2,src1);
    MIR_output_insn(ctx,(FILE *)pVVar12[1].els_num,(MIR_insn_t_conflict)nb->els_num,
                    (MIR_func_t)pVVar12->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_and_compl (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_and_compl);
}